

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaturalLogarithmExpression.cpp
# Opt level: O2

BaseExpressionPtr __thiscall
Kandinsky::NaturalLogarithmExpression::derivative
          (NaturalLogarithmExpression *this,VariableExpressionPtr *variable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  BaseExpressionPtr BVar1;
  shared_ptr<Kandinsky::BaseExpression> local_60;
  int local_4c;
  Expression local_48;
  Expression local_30;
  
  local_4c = 1;
  operator/<int,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_48,&local_4c,
             (shared_ptr<Kandinsky::BaseExpression> *)
             &(variable->
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  (*((variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
     _M_refcount._M_pi)->_vptr__Sp_counted_base[1])(&local_60);
  operator*<Kandinsky::Expression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_30,&local_48,&local_60);
  BaseExpression::makePtr<Kandinsky::Expression>((BaseExpression *)this,&local_30);
  Expression::~Expression(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Expression::~Expression(&local_48);
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr NaturalLogarithmExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(1 / m_arg * m_arg->derivative(variable));
    }